

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaeger_types.cpp
# Opt level: O0

ssize_t __thiscall
jaegertracing::thrift::SpanRef::read(SpanRef *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t uVar1;
  uint uVar2;
  TProtocolException *pTVar3;
  undefined4 in_register_00000034;
  type local_64;
  byte local_60;
  byte local_5f;
  byte local_5e;
  byte local_5d;
  int32_t ecast11;
  bool isset_spanId;
  bool isset_traceIdHigh;
  bool isset_traceIdLow;
  bool isset_refType;
  int16_t local_4e;
  TType local_4c;
  undefined1 local_48 [2];
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  TProtocol *iprot_local;
  SpanRef *this_local;
  
  tracker.prot_ = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)&stack0xffffffffffffffe0,tracker.prot_);
  fname.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_48);
  uVar1 = apache::thrift::protocol::TProtocol::readStructBegin(tracker.prot_,(string *)local_48);
  fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
  local_5d = 0;
  local_5e = 0;
  local_5f = 0;
  local_60 = 0;
  while( true ) {
    uVar1 = apache::thrift::protocol::TProtocol::readFieldBegin
                      (tracker.prot_,(string *)local_48,&local_4c,&local_4e);
    fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
    if (local_4c == T_STOP) break;
    switch(local_4e) {
    case 1:
      if (local_4c == T_I32) {
        uVar1 = apache::thrift::protocol::TProtocol::readI32(tracker.prot_,(int32_t *)&local_64);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        this->refType = local_64;
        local_5d = 1;
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
      break;
    case 2:
      if (local_4c == T_I64) {
        uVar1 = apache::thrift::protocol::TProtocol::readI64(tracker.prot_,&this->traceIdLow);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        local_5e = 1;
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
      break;
    case 3:
      if (local_4c == T_I64) {
        uVar1 = apache::thrift::protocol::TProtocol::readI64(tracker.prot_,&this->traceIdHigh);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        local_5f = 1;
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
      break;
    case 4:
      if (local_4c == T_I64) {
        uVar1 = apache::thrift::protocol::TProtocol::readI64(tracker.prot_,&this->spanId);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
        local_60 = 1;
      }
      else {
        uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
        fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
      }
      break;
    default:
      uVar1 = apache::thrift::protocol::TProtocol::skip(tracker.prot_,local_4c);
      fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
    }
    uVar1 = apache::thrift::protocol::TProtocol::readFieldEnd(tracker.prot_);
    fname.field_2._12_4_ = uVar1 + fname.field_2._12_4_;
  }
  uVar1 = apache::thrift::protocol::TProtocol::readStructEnd(tracker.prot_);
  uVar2 = uVar1 + fname.field_2._12_4_;
  fname.field_2._12_4_ = uVar2;
  if ((local_5d & 1) == 0) {
    pTVar3 = (TProtocolException *)__cxa_allocate_exception(0x30);
    apache::thrift::protocol::TProtocolException::TProtocolException(pTVar3,INVALID_DATA);
    __cxa_throw(pTVar3,&apache::thrift::protocol::TProtocolException::typeinfo,
                apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if ((local_5e & 1) == 0) {
    pTVar3 = (TProtocolException *)__cxa_allocate_exception(0x30);
    apache::thrift::protocol::TProtocolException::TProtocolException(pTVar3,INVALID_DATA);
    __cxa_throw(pTVar3,&apache::thrift::protocol::TProtocolException::typeinfo,
                apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  if ((local_5f & 1) != 0) {
    if ((local_60 & 1) != 0) {
      std::__cxx11::string::~string((string *)local_48);
      apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
                ((TInputRecursionTracker *)&stack0xffffffffffffffe0);
      return (ulong)uVar2;
    }
    pTVar3 = (TProtocolException *)__cxa_allocate_exception(0x30);
    apache::thrift::protocol::TProtocolException::TProtocolException(pTVar3,INVALID_DATA);
    __cxa_throw(pTVar3,&apache::thrift::protocol::TProtocolException::typeinfo,
                apache::thrift::protocol::TProtocolException::~TProtocolException);
  }
  pTVar3 = (TProtocolException *)__cxa_allocate_exception(0x30);
  apache::thrift::protocol::TProtocolException::TProtocolException(pTVar3,INVALID_DATA);
  __cxa_throw(pTVar3,&apache::thrift::protocol::TProtocolException::typeinfo,
              apache::thrift::protocol::TProtocolException::~TProtocolException);
}

Assistant:

uint32_t SpanRef::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_refType = false;
  bool isset_traceIdLow = false;
  bool isset_traceIdHigh = false;
  bool isset_spanId = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast11;
          xfer += iprot->readI32(ecast11);
          this->refType = (SpanRefType::type)ecast11;
          isset_refType = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->traceIdLow);
          isset_traceIdLow = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->traceIdHigh);
          isset_traceIdHigh = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_I64) {
          xfer += iprot->readI64(this->spanId);
          isset_spanId = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_refType)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_traceIdLow)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_traceIdHigh)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  if (!isset_spanId)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}